

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  undefined1 uVar2;
  int top_k_00;
  int iVar3;
  time_t tVar4;
  ulong uVar5;
  gpt_vocab *vocab_00;
  undefined8 uVar6;
  ggml_backend **ppgVar7;
  size_type sVar8;
  int *piVar9;
  ggml_cgraph *pgVar10;
  reference ppgVar11;
  uint *puVar12;
  allocator_type *paVar13;
  reference piVar14;
  reference pvVar15;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *this;
  reference ppgVar16;
  reference ppgVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ggml_backend *backend;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *__range1_1;
  ggml_backend_buffer *buf;
  iterator __end1;
  iterator __begin1;
  vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> *__range1;
  int64_t t_main_end_us;
  int id_1;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_t k;
  int64_t t_start_sample_us;
  id id;
  int n_vocab;
  float temp;
  float top_p;
  int top_k;
  int64_t t_start_us_1;
  size_t i_2;
  vector<int,_std::allocator<int>_> embd;
  int i_1;
  vector<int,_std::allocator<int>_> embd_inp;
  vector<float,_std::allocator<float>_> logits;
  int64_t t_predict_us;
  int64_t t_sample_us;
  int n_past;
  size_t size;
  size_t i;
  size_t mem_size;
  ggml_cgraph *gf;
  int n_past_1;
  int n_tokens;
  ggml_backend_sched_t sched;
  int64_t t_start_us;
  gpt2_model model;
  gpt_vocab vocab;
  int64_t t_load_us;
  mt19937 rng;
  gpt_params params;
  int64_t t_main_start_us;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe798;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe7a0;
  allocator_type *in_stack_ffffffffffffe7a8;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe7b0;
  size_type in_stack_ffffffffffffe7b8;
  vector<float,_std::allocator<float>_> *this_00;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe7c0;
  undefined4 in_stack_ffffffffffffe7c8;
  id in_stack_ffffffffffffe7cc;
  long in_stack_ffffffffffffe7d0;
  allocator_type *in_stack_ffffffffffffe7d8;
  gpt2_model *in_stack_ffffffffffffe7e0;
  gpt_params *in_stack_ffffffffffffe7f0;
  mt19937 *in_stack_ffffffffffffe828;
  undefined7 in_stack_ffffffffffffe898;
  __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
  local_1740;
  undefined1 *local_1738;
  ggml_backend_buffer *local_1730;
  ggml_backend_buffer **local_1728;
  __normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
  local_1720;
  undefined1 *local_1718;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *local_1710;
  int local_1704;
  int *local_1700;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_16f8;
  undefined1 *local_16f0;
  allocator_type *local_16e8;
  long local_16e0;
  id local_16d4;
  undefined4 local_16d0;
  undefined4 local_16cc;
  undefined4 local_16c8;
  undefined4 local_16c4;
  long local_16c0;
  allocator_type *local_16b8;
  undefined1 local_16b0 [8];
  mt19937 *in_stack_ffffffffffffe958;
  pointer in_stack_ffffffffffffe960;
  int iVar20;
  int local_1690;
  float *in_stack_ffffffffffffe978;
  gpt_vocab *in_stack_ffffffffffffe980;
  vector<float,_std::allocator<float>_> local_1670;
  long local_1658;
  long local_1650;
  int local_1644;
  long local_1640;
  ulong local_1638;
  long local_1630;
  undefined4 local_1624;
  ggml_cgraph *local_1608;
  int local_1600;
  int local_15fc;
  undefined8 local_15f8;
  gpt_vocab *local_15f0;
  undefined4 local_15e8;
  int local_15e4;
  string *in_stack_ffffffffffffea20;
  gpt_vocab *in_stack_ffffffffffffea28;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffea80;
  undefined4 local_1578;
  int in_stack_ffffffffffffea8c;
  gpt2_model *in_stack_ffffffffffffea90;
  undefined1 auStack_1558 [24];
  undefined8 local_1540;
  long local_1478;
  string local_1470 [336];
  gpt_params *in_stack_ffffffffffffece0;
  char **in_stack_ffffffffffffece8;
  int in_stack_ffffffffffffecf4;
  gpt_params *in_stack_fffffffffffff810;
  gpt_vocab *in_stack_fffffffffffff818;
  gpt2_model *in_stack_fffffffffffff820;
  string *in_stack_fffffffffffff828;
  uint local_b8;
  int local_b0 [2];
  int local_a8 [4];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  string local_80 [32];
  string local_60 [72];
  long local_18;
  int local_4;
  
  local_4 = 0;
  ggml_time_init();
  local_18 = ggml_time_us();
  gpt_params::gpt_params(in_stack_ffffffffffffe7f0);
  std::__cxx11::string::operator=(local_80,"models/gpt-2-117M/ggml-model.bin");
  bVar1 = gpt_params_parse(in_stack_ffffffffffffecf4,in_stack_ffffffffffffece8,
                           in_stack_ffffffffffffece0);
  if (bVar1) {
    if ((int)local_b8 < 0) {
      tVar4 = time((time_t *)0x0);
      local_b8 = (uint)tVar4;
    }
    printf("%s: seed = %d\n","main",(ulong)local_b8);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(in_stack_ffffffffffffe7a0,(result_type)in_stack_ffffffffffffe798);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      gpt_random_prompt_abi_cxx11_(in_stack_ffffffffffffe828);
      std::__cxx11::string::operator=(local_60,local_1470);
      std::__cxx11::string::~string(local_1470);
    }
    local_1478 = 0;
    gpt_vocab::gpt_vocab((gpt_vocab *)in_stack_ffffffffffffe7a0);
    gpt2_model::gpt2_model((gpt2_model *)in_stack_ffffffffffffe7a0);
    vocab_00 = (gpt_vocab *)ggml_time_us();
    local_15f0 = vocab_00;
    uVar2 = gpt2_model_load(in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                            in_stack_fffffffffffff818,in_stack_fffffffffffff810);
    __stream = _stderr;
    if ((bool)uVar2) {
      local_1478 = ggml_time_us();
      local_1478 = local_1478 - (long)local_15f0;
      test_gpt_tokenizer(vocab_00,(string *)CONCAT17(uVar2,in_stack_ffffffffffffe898));
      ppgVar7 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::data
                          ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)0x116540);
      sVar8 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::size
                        ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)
                         &stack0xffffffffffffea90);
      local_15f8 = ggml_backend_sched_new(ppgVar7,0,sVar8 & 0xffffffff,0x1000);
      piVar9 = std::min<int>(&local_15e4,local_a8);
      local_15fc = *piVar9;
      local_1600 = local_15e4 - local_15fc;
      local_1624 = 0;
      std::allocator<int>::allocator((allocator<int> *)0x11660e);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7c0,
                 in_stack_ffffffffffffe7b8,(value_type_conflict3 *)in_stack_ffffffffffffe7b0,
                 in_stack_ffffffffffffe7a8);
      pgVar10 = gpt2_graph(in_stack_ffffffffffffea90,in_stack_ffffffffffffea8c,
                           in_stack_ffffffffffffea80);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7b0);
      std::allocator<int>::~allocator((allocator<int> *)0x116675);
      local_1608 = pgVar10;
      ggml_backend_sched_reserve(local_15f8,pgVar10);
      local_1630 = 0;
      for (local_1638 = 0; uVar5 = local_1638,
          sVar8 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::size
                            ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)
                             &stack0xffffffffffffea90), uVar6 = local_15f8, uVar5 < sVar8;
          local_1638 = local_1638 + 1) {
        ppgVar11 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::operator[]
                             ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)
                              &stack0xffffffffffffea90,local_1638);
        local_1640 = ggml_backend_sched_get_buffer_size(uVar6,*ppgVar11);
        if (local_1640 != 0) {
          local_1630 = local_1630 + local_1640;
          ppgVar11 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::operator[]
                               ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)
                                &stack0xffffffffffffea90,local_1638);
          uVar6 = ggml_backend_name(*ppgVar11);
          auVar18._8_4_ = (int)((ulong)local_1640 >> 0x20);
          auVar18._0_8_ = local_1640;
          auVar18._12_4_ = 0x45300000;
          printf("%s: %8s compute buffer size = %8.2f MB\n",
                 ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_1640) - 4503599627370496.0)) * 0.0009765625
                 * 0.0009765625,"main",uVar6);
        }
      }
      auVar19._8_4_ = (int)((ulong)local_1630 >> 0x20);
      auVar19._0_8_ = local_1630;
      auVar19._12_4_ = 0x45300000;
      printf("%s: total compute buffer size: %.2f MB\n",
             ((auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_1630) - 4503599627370496.0)) * 0.0009765625 *
             0.0009765625,"main");
      local_1644 = 0;
      local_1650 = 0;
      local_1658 = 0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1168cb);
      gpt_tokenize(in_stack_ffffffffffffea28,in_stack_ffffffffffffea20);
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe978);
      top_k_00 = local_15e4 - (int)sVar8;
      piVar9 = std::min<int>(local_b0,(int *)&stack0xffffffffffffe974);
      local_b0[0] = *piVar9;
      uVar6 = std::__cxx11::string::c_str();
      printf("%s: prompt: \'%s\'\n","main",uVar6);
      sVar8 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe978);
      printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",sVar8);
      local_1690 = 0;
      while( true ) {
        iVar20 = 8;
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe978);
        iVar3 = (int)sVar8;
        piVar9 = std::min<int>((int *)&stack0xffffffffffffe96c,(int *)&stack0xffffffffffffe968);
        if (*piVar9 <= local_1690) break;
        puVar12 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe978,
                                     (long)local_1690);
        printf("%d ",(ulong)*puVar12);
        local_1690 = local_1690 + 1;
      }
      printf("\n\n");
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x116a8c);
      for (local_16b8 = (allocator_type *)
                        std::vector<int,_std::allocator<int>_>::size
                                  ((vector<int,_std::allocator<int>_> *)local_16b0);
          paVar13 = local_16b8,
          sVar8 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe978),
          paVar13 < (allocator_type *)(sVar8 + (long)local_b0[0]); local_16b8 = local_16b8 + 1) {
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_16b0);
        if (sVar8 != 0) {
          local_16c0 = ggml_time_us();
          bVar1 = gpt2_eval(in_stack_ffffffffffffe7e0,
                            (ggml_backend_sched_t)in_stack_ffffffffffffe7d8,
                            (int)((ulong)in_stack_ffffffffffffe7d0 >> 0x20),
                            (vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8),
                            in_stack_ffffffffffffe7c0);
          if (!bVar1) {
            printf("Failed to predict\n");
            local_4 = 1;
            goto LAB_0011715d;
          }
          in_stack_ffffffffffffe7e0 = (gpt2_model *)ggml_time_us();
          local_1658 = (long)in_stack_ffffffffffffe7e0 + (local_1658 - local_16c0);
        }
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_16b0);
        local_1644 = local_1644 + (int)sVar8;
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x116bec)
        ;
        in_stack_ffffffffffffe7d8 = local_16b8;
        paVar13 = (allocator_type *)
                  std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe978);
        if (in_stack_ffffffffffffe7d8 < paVar13) {
          local_16e8 = local_16b8;
          while (in_stack_ffffffffffffe7a8 = local_16e8,
                paVar13 = (allocator_type *)
                          std::vector<int,_std::allocator<int>_>::size
                                    ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe978),
                in_stack_ffffffffffffe7a8 < paVar13) {
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffe978,
                       (size_type)local_16e8);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7b0,
                       (value_type_conflict3 *)in_stack_ffffffffffffe7a8);
            sVar8 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_16b0);
            if (local_a8[0] <= (int)sVar8) break;
            local_16e8 = local_16e8 + 1;
          }
          sVar8 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_16b0);
          local_16b8 = local_16b8 + (sVar8 - 1);
        }
        else {
          local_16c4 = local_98;
          local_16c8 = local_94;
          local_16cc = local_90;
          local_16d0 = local_15e8;
          local_16d4 = 0;
          in_stack_ffffffffffffe7d0 = ggml_time_us();
          this_00 = &local_1670;
          local_16e0 = in_stack_ffffffffffffe7d0;
          in_stack_ffffffffffffe7c0 =
               (vector<float,_std::allocator<float>_> *)
               std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x116c8d);
          std::vector<float,_std::allocator<float>_>::size(this_00);
          in_stack_ffffffffffffe7cc =
               gpt_sample_top_k_top_p
                         (in_stack_ffffffffffffe980,in_stack_ffffffffffffe978,top_k_00,
                          (double)CONCAT44(iVar20,iVar3),(double)in_stack_ffffffffffffe960,
                          in_stack_ffffffffffffe958);
          local_16d4 = in_stack_ffffffffffffe7cc;
          in_stack_ffffffffffffe7b0 = (vector<float,_std::allocator<float>_> *)ggml_time_us();
          local_1650 = (long)in_stack_ffffffffffffe7b0 + (local_1650 - local_16e0);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7b0,
                     (value_type_conflict3 *)in_stack_ffffffffffffe7a8);
        }
        local_16f0 = local_16b0;
        local_16f8._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffe798);
        local_1700 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffe798);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffe7a0,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_ffffffffffffe798), bVar1) {
          piVar14 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&local_16f8);
          local_1704 = *piVar14;
          in_stack_ffffffffffffe7a0 =
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_ffffffffffffe7e0,(key_type *)in_stack_ffffffffffffe7d8);
          uVar6 = std::__cxx11::string::c_str();
          printf("%s",uVar6);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_16f8);
        }
        fflush(_stdout);
        pvVar15 = std::vector<int,_std::allocator<int>_>::back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7a0);
        if (*pvVar15 == 0xc450) break;
      }
      this = (vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)ggml_time_us();
      local_1710 = this;
      printf("\n\n");
      printf("%s:     load time = %8.2f ms\n",(double)((float)local_1478 / 1000.0),"main");
      printf("%s:   sample time = %8.2f ms\n",(double)((float)local_1650 / 1000.0),"main");
      printf("%s:  predict time = %8.2f ms / %.2f ms per token\n",
             (double)((float)local_1658 / 1000.0),
             (double)(((float)local_1658 / 1000.0) / (float)local_1644),"main");
      printf("%s:    total time = %8.2f ms\n",
             (double)((float)((long)local_1710 - local_18) / 1000.0),"main");
      ggml_free(CONCAT44(in_stack_ffffffffffffea8c,local_1578));
      ggml_backend_sched_free(local_15f8);
      ggml_backend_buffer_free(local_1540);
      local_1718 = auStack_1558;
      local_1720._M_current =
           (ggml_backend_buffer **)
           std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::begin
                     ((vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> *)this)
      ;
      local_1728 = (ggml_backend_buffer **)
                   std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::end
                             ((vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>
                               *)this);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
                                 *)in_stack_ffffffffffffe7a0,
                                (__normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
                                 *)this), bVar1) {
        ppgVar16 = __gnu_cxx::
                   __normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
                   ::operator*(&local_1720);
        local_1730 = *ppgVar16;
        ggml_backend_buffer_free(local_1730);
        __gnu_cxx::
        __normal_iterator<ggml_backend_buffer_**,_std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>_>
        ::operator++(&local_1720);
      }
      local_1738 = &stack0xffffffffffffea90;
      local_1740._M_current =
           (ggml_backend **)
           std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::begin(this);
      std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::end(this);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
                                 *)in_stack_ffffffffffffe7a0,
                                (__normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
                                 *)this), bVar1) {
        ppgVar17 = __gnu_cxx::
                   __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
                   ::operator*(&local_1740);
        ggml_backend_free(*ppgVar17);
        __gnu_cxx::
        __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
        ::operator++(&local_1740);
      }
      local_4 = 0;
LAB_0011715d:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7b0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7b0);
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_ffffffffffffe7b0);
    }
    else {
      uVar6 = std::__cxx11::string::c_str();
      fprintf(__stream,"%s: failed to load model from \'%s\'\n","main",uVar6);
      local_4 = 1;
    }
    gpt2_model::~gpt2_model((gpt2_model *)in_stack_ffffffffffffe7a0);
    gpt_vocab::~gpt_vocab((gpt_vocab *)in_stack_ffffffffffffe7a0);
  }
  else {
    local_4 = 1;
  }
  gpt_params::~gpt_params((gpt_params *)in_stack_ffffffffffffe7a0);
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;
    params.model = "models/gpt-2-117M/ggml-model.bin";

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab, params)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    // create the backend scheduler
    // the scheduler handles the allocation of the compute buffers and the scheduling of the computation between the different backends
    ggml_backend_sched_t sched;
    {
        // initialize the scheduler
        sched = ggml_backend_sched_new(model.backends.data(), NULL, model.backends.size(), GPT2_MAX_NODES, false);

        // create the worst case graph for memory usage estimation
        int n_tokens = std::min(model.hparams.n_ctx, params.n_batch);
        int n_past = model.hparams.n_ctx - n_tokens;
        struct ggml_cgraph * gf = gpt2_graph(model, n_past, std::vector<gpt_vocab::id>(n_tokens, 0));

        ggml_backend_sched_reserve(sched, gf);


        // compute the required memory
        size_t mem_size = 0;
        for (size_t i = 0; i < model.backends.size(); i++) {
            size_t size = ggml_backend_sched_get_buffer_size(sched, model.backends[i]);
            if (size > 0) {
                mem_size += size;
                printf("%s: %8s compute buffer size = %8.2f MB\n", __func__, ggml_backend_name(model.backends[i]), size/1024.0/1024.0);
                //printf("%s: %8s compute buffer size = %zu bytes\n", __func__, ggml_backend_name(model.backends[i]), size);
            }
        }

        printf("%s: total compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int n_past = 0;

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    // submit the input prompt token-by-token
    // this reduces the memory usage during inference, at the cost of a bit of speed at the beginning
    std::vector<gpt_vocab::id> embd;

    for (size_t i = embd.size(); i < embd_inp.size() + params.n_predict; i++) {
        // predict
        if (embd.size() > 0) {
            const int64_t t_start_us = ggml_time_us();

            if (!gpt2_eval(model, sched, n_past, embd, logits)) {
                printf("Failed to predict\n");
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }

        n_past += embd.size();
        embd.clear();

        if (i >= embd_inp.size()) {
            // sample next token
            const int   top_k = params.top_k;
            const float top_p = params.top_p;
            const float temp  = params.temp;

            const int n_vocab = model.hparams.n_vocab;

            gpt_vocab::id id = 0;

            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits.data() + (logits.size() - n_vocab), top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // add it to the context
            embd.push_back(id);
        } else {
            // if here, it means we are still processing the input prompt
            for (size_t k = i; k < embd_inp.size(); k++) {
                embd.push_back(embd_inp[k]);
                if (int32_t(embd.size()) >= params.n_batch) {
                    break;
                }
            }
            i += embd.size() - 1;
        }

        // display text
        for (auto id : embd) {
            printf("%s", vocab.id_to_token[id].c_str());
        }
        fflush(stdout);

        // end of text token
        if (embd.back() == 50256) {
            break;
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms / %.2f ms per token\n", __func__, t_predict_us/1000.0f, t_predict_us/1000.0f/n_past);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    ggml_free(model.ctx_w);

    ggml_backend_sched_free(sched);
    ggml_backend_buffer_free(model.buffer_kv);
    for (auto buf : model.buffers_w) {
        ggml_backend_buffer_free(buf);
    }
    for (auto backend : model.backends) {
        ggml_backend_free(backend);
    }

    return 0;
}